

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O1

String * __thiscall
kj::_::concat<kj::StringPtr,kj::ArrayPtr<char_const>>
          (String *__return_storage_ptr__,_ *this,StringPtr *params,ArrayPtr<const_char> *params_1)

{
  void *__src;
  size_t __n;
  long lVar1;
  size_t size;
  char *__dest;
  long local_30 [2];
  
  local_30[0] = *(long *)(this + 8) + -1;
  local_30[1] = (params->content).size_;
  size = 0;
  lVar1 = 0;
  do {
    size = size + *(long *)((long)local_30 + lVar1);
    lVar1 = lVar1 + 8;
  } while (lVar1 != 0x10);
  heapString(__return_storage_ptr__,size);
  __dest = (char *)(__return_storage_ptr__->content).size_;
  if (__dest != (char *)0x0) {
    __dest = (__return_storage_ptr__->content).ptr;
  }
  __src = *(void **)this;
  lVar1 = *(long *)(this + 8);
  if (__src != (void *)((long)__src + lVar1 + -1)) {
    memcpy(__dest,__src,lVar1 - 1);
    __dest = __dest + lVar1 + -1;
  }
  __n = (params->content).size_;
  if (__n != 0) {
    memcpy(__dest,(params->content).ptr,__n);
  }
  return __return_storage_ptr__;
}

Assistant:

String concat(Params&&... params) {
  // Concatenate a bunch of containers into a single Array.  The containers can be anything that
  // is iterable and whose elements can be converted to `char`.

  String result = heapString(sum({params.size()...}));
  fill(result.begin(), kj::fwd<Params>(params)...);
  return result;
}